

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

Am_Object in_target(Am_Object *top_level,Am_Object *in_leaf,Am_Object *event_window,int x,int y)

{
  int y_00;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  int x_00;
  uint in_R9D;
  Am_Object owner;
  Am_Object leaf;
  Am_Object new_leaf;
  Am_Value target_value;
  Am_Value_List parts;
  Am_Object local_90;
  Am_Object_Data *local_88;
  Am_Object local_80;
  Am_Object local_78;
  int local_6c;
  Am_Object local_68;
  Am_Value local_60;
  Am_Object *local_50;
  Am_Object local_48;
  Am_Value_List local_40;
  
  local_88 = (Am_Object_Data *)top_level;
  pAVar2 = Am_Object::Get(event_window,0x1a1,1);
  Am_Value::Am_Value(&local_60,pAVar2);
  bVar1 = Am_Value::Valid(&local_60);
  if (!bVar1) {
    bVar1 = Am_Object::operator==(event_window,in_leaf);
    if (!bVar1) {
      Am_Object::Get_Object(&local_90,(Am_Slot_Key)event_window,10);
      local_6c = y;
      local_50 = in_leaf;
      Am_Object::Am_Object(&local_80,event_window);
      while( true ) {
        Am_Object::Am_Object(&local_68,local_50);
        bVar1 = Am_Object::Is_Part_Of(&local_90,&local_68);
        Am_Object::~Am_Object(&local_68);
        if (!bVar1) break;
        pAVar2 = Am_Object::Get(&local_90,0x82,0);
        Am_Value_List::Am_Value_List(&local_40,pAVar2);
        Am_Value_List::Start(&local_40);
        y_00 = local_6c;
        value = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
        Am_Value_List::Member(&local_40,value);
        Am_Value_List::Prev(&local_40);
        while( true ) {
          bVar1 = Am_Value_List::First(&local_40);
          if (bVar1) break;
          pAVar2 = Am_Value_List::Get(&local_40);
          Am_Object::operator=(&local_80,pAVar2);
          x_00 = (int)&local_80;
          Am_Point_In_Obj(&local_78,x_00,y_00,(Am_Object *)(ulong)in_R9D);
          bVar1 = Am_Object::Valid(&local_78);
          Am_Object::~Am_Object(&local_78);
          if (bVar1) {
            Am_Point_In_Leaf(&local_78,x_00,y_00,(Am_Object *)(ulong)in_R9D,SUB41(x,0),true);
            bVar1 = Am_Object::Valid(&local_78);
            if (bVar1) {
              in_target(&local_48,&local_80,&local_78,x,y_00);
              Am_Object::operator=(&local_80,&local_48);
              Am_Object::~Am_Object(&local_48);
              bVar1 = Am_Object::Valid(&local_80);
              if (bVar1) {
                Am_Object::Am_Object((Am_Object *)local_88,&local_80);
                Am_Object::~Am_Object(&local_78);
                goto LAB_00259b22;
              }
            }
            Am_Object::~Am_Object(&local_78);
          }
          Am_Value_List::Prev(&local_40);
        }
        Am_Object::operator=(&local_80,&local_90);
        pAVar2 = Am_Object::Get(&local_80,0x1a1,1);
        Am_Value::operator=(&local_60,pAVar2);
        bVar1 = Am_Value::Valid(&local_60);
        if (bVar1) {
          Am_Object::Am_Object((Am_Object *)local_88,&local_80);
LAB_00259b22:
          Am_Value_List::~Am_Value_List(&local_40);
          goto LAB_00259b2c;
        }
        Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_80,10);
        Am_Object::operator=(&local_90,&local_78);
        Am_Object::~Am_Object(&local_78);
        Am_Value_List::~Am_Value_List(&local_40);
      }
      Am_Object::Am_Object((Am_Object *)local_88,&Am_No_Object);
LAB_00259b2c:
      Am_Object::~Am_Object(&local_80);
      Am_Object::~Am_Object(&local_90);
      goto LAB_00259b40;
    }
    event_window = &Am_No_Object;
  }
  Am_Object::Am_Object((Am_Object *)local_88,event_window);
LAB_00259b40:
  Am_Value::~Am_Value(&local_60);
  return (Am_Object)local_88;
}

Assistant:

static Am_Object
in_target(Am_Object &top_level, Am_Object &in_leaf, Am_Object &event_window,
          int x, int y)
{
  Am_Value target_value = in_leaf.Peek(Am_DROP_TARGET);
  if (target_value.Valid())
    return in_leaf;
  if (in_leaf == top_level)
    return Am_No_Object;
  Am_Object owner = in_leaf.Get_Owner();
  Am_Object leaf = in_leaf;
  while (owner.Is_Part_Of(top_level)) {
    Am_Value_List parts = owner.Get(Am_GRAPHICAL_PARTS);
    parts.Start();
    parts.Member(leaf);
    parts.Prev();
    while (!parts.First()) {
      leaf = parts.Get();
      if (Am_Point_In_Obj(leaf, x, y, event_window).Valid()) {
        Am_Object new_leaf = Am_Point_In_Leaf(leaf, x, y, event_window);
        if (new_leaf.Valid()) {
          leaf = in_target(leaf, new_leaf, event_window, x, y);
          if (leaf.Valid())
            return leaf;
        }
      }
      parts.Prev();
    }
    leaf = owner;
    target_value = leaf.Peek(Am_DROP_TARGET);
    if (target_value.Valid())
      return leaf;
    owner = leaf.Get_Owner();
  }
  return Am_No_Object;
}